

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSAPublicKey.cpp
# Opt level: O2

bool __thiscall RSAPublicKey::deserialise(RSAPublicKey *this,ByteString *serialised)

{
  size_t sVar1;
  bool bVar2;
  ByteString dE;
  ByteString dN;
  ByteString BStack_68;
  ByteString local_40;
  
  ByteString::chainDeserialise(&local_40,serialised);
  ByteString::chainDeserialise(&BStack_68,serialised);
  sVar1 = ByteString::size(&local_40);
  if (sVar1 != 0) {
    sVar1 = ByteString::size(&BStack_68);
    if (sVar1 != 0) {
      (**(code **)(*(long *)this + 0x30))(this,&local_40);
      bVar2 = true;
      (**(code **)(*(long *)this + 0x38))(this,&BStack_68);
      goto LAB_0014dd84;
    }
  }
  bVar2 = false;
LAB_0014dd84:
  ByteString::~ByteString(&BStack_68);
  ByteString::~ByteString(&local_40);
  return bVar2;
}

Assistant:

bool RSAPublicKey::deserialise(ByteString& serialised)
{
	ByteString dN = ByteString::chainDeserialise(serialised);
	ByteString dE = ByteString::chainDeserialise(serialised);

	if ((dN.size() == 0) ||
	    (dE.size() == 0))
	{
		return false;
	}

	setN(dN);
	setE(dE);

	return true;
}